

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

gvector gvector_dup(gvector_const v)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  void *pvVar4;
  ulong uVar5;
  
  if (v == (gvector_const)0x0) {
    return (gvector)0x0;
  }
  uVar1 = *(ulong *)((long)v + -0x10);
  uVar2 = *(ulong *)((long)v + -8);
  if (uVar1 != 0) {
    uVar5 = *(ulong *)((long)v + -0x18);
    puVar3 = (ulong *)malloc(uVar1 * uVar5 + 0x18);
    if (puVar3 != (ulong *)0x0) {
      *puVar3 = uVar5;
      if (uVar2 < uVar5) {
        uVar5 = uVar2;
      }
      puVar3[1] = uVar1;
      puVar3[2] = uVar5;
      puVar3 = puVar3 + 3;
      goto LAB_0015e9de;
    }
  }
  puVar3 = (ulong *)0x0;
LAB_0015e9de:
  if (puVar3 == (ulong *)0x0) {
    return (gvector)0x0;
  }
  pvVar4 = memcpy(puVar3,v,uVar1 * uVar2);
  return pvVar4;
}

Assistant:

gvector gvector_dup(gvector_const v)
{
  if (v)
  {
    gvector *w = gvector_alloc(gvector_cap(v), gvector_len(v), gvector_size(v));
    if (w)
    {
      memcpy(w, v, gvector_len(v) * gvector_size(v));
    }
    return w;
  }
  return NULL;
}